

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_bfins_32_ai(void)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  sbyte sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar5 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar5);
  }
  uVar5 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
  uVar2 = uVar5 >> 10;
  if ((uVar5 >> 0xb & 1) == 0) {
    uVar9 = uVar5 >> 6 & 0x1f;
  }
  else {
    uVar9 = m68ki_cpu.dar[uVar5 >> 6 & 7];
  }
  if ((uVar5 & 0x20) != 0) {
    uVar5 = m68ki_cpu.dar[uVar5 & 7];
  }
  uVar7 = uVar9 + 7;
  if (-1 < (int)uVar9) {
    uVar7 = uVar9;
  }
  uVar6 = ((int)uVar7 >> 3) + m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] + -1 +
          (uint)((uVar9 & 0x80000007) < 0x80000001);
  uVar8 = uVar5 - 1 & 0x1f;
  bVar1 = (byte)uVar8 ^ 0x1f;
  uVar7 = -1 << bVar1;
  sVar4 = (sbyte)(uVar9 & 7);
  uVar2 = *(int *)((long)m68ki_cpu.dar + (ulong)(uVar2 & 0x1c)) << bVar1;
  m68ki_cpu.n_flag = uVar2 >> 0x18;
  m68ki_cpu.not_z_flag = uVar2;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar5 = uVar6;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar6);
  }
  uVar3 = m68k_read_memory_32(uVar5 & m68ki_cpu.address_mask);
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  uVar5 = uVar6;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar6);
  }
  m68k_write_memory_32(uVar5 & m68ki_cpu.address_mask,~(uVar7 >> sVar4) & uVar3 | uVar2 >> sVar4);
  if (0x20 < (uVar9 & 7) + uVar8 + 1) {
    uVar7 = uVar7 & 0xff;
    uVar6 = uVar6 + 4;
    my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
    uVar5 = uVar6;
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar5 = pmmu_translate_addr(uVar6);
    }
    uVar8 = m68k_read_memory_8(uVar5 & m68ki_cpu.address_mask);
    m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | uVar8 & uVar7;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar6 = pmmu_translate_addr(uVar6);
    }
    m68k_write_memory_8(uVar6 & m68ki_cpu.address_mask,~uVar7 & uVar8 | uVar2 & 0xff);
    return;
  }
  return;
}

Assistant:

static void m68k_op_bfins_32_ai(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint insert_base = REG_D[(word2>>12)&7];
		uint insert_long;
		uint insert_byte;
		uint mask_base;
		uint data_long;
		uint mask_long;
		uint data_byte = 0;
		uint mask_byte = 0;
		uint ea = EA_AY_AI_8();


		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;

		mask_base = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask_long = mask_base >> offset;

		insert_base = MASK_OUT_ABOVE_32(insert_base << (32 - width));
		FLAG_N = NFLAG_32(insert_base);
		FLAG_Z = insert_base;
		insert_long = insert_base >> offset;

		data_long = m68ki_read_32(ea);

        FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		m68ki_write_32(ea, (data_long & ~mask_long) | insert_long);

		if((width + offset) > 32)
		{
			mask_byte = MASK_OUT_ABOVE_8(mask_base);
			insert_byte = MASK_OUT_ABOVE_8(insert_base);
			data_byte = m68ki_read_8(ea+4);
			FLAG_Z |= (data_byte & mask_byte);
			m68ki_write_8(ea+4, (data_byte & ~mask_byte) | insert_byte);
		}
		return;
	}
	m68ki_exception_illegal();
}